

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_short,(unsigned_char)8>,unsigned_int>
          (Thread *this)

{
  undefined1 auVar1 [16];
  Value VVar2;
  
  VVar2 = Pop(this);
  auVar1 = pshuflw(ZEXT416(VVar2.field_0.i32_),ZEXT416(VVar2.field_0.i32_),0);
  VVar2.field_0._8_8_ = auVar1._0_8_;
  VVar2.field_0.i64_ = VVar2.field_0._8_8_;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}